

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool op_xta(DisasContext_conflict1 *s,arg_rrr_rot *a,VFPGen2OpSPFn_conflict *gen_extract,
            _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_conflict1 *gen_add)

{
  int iVar1;
  ulong uVar2;
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *s_01;
  TCGTemp *pTVar3;
  TCGv_i32 var;
  uintptr_t o;
  TCGv_i32 var_00;
  TCGContext_conflict1 *tcg_ctx;
  
  uVar2 = s->features;
  if ((uVar2 & 8) != 0) {
    s_00 = s->uc->tcg_ctx;
    iVar1 = a->rm;
    pTVar3 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    var = (TCGv_i32)((long)pTVar3 - (long)s_00);
    load_reg_var(s,var,iVar1);
    tcg_gen_rotri_i32_aarch64(s_00,var,var,a->rot << 3);
    (*gen_extract)(s_00,var,var);
    iVar1 = a->rn;
    if (iVar1 != 0xf) {
      s_01 = s->uc->tcg_ctx;
      pTVar3 = tcg_temp_new_internal_aarch64(s_01,TCG_TYPE_I32,false);
      var_00 = (TCGv_i32)((long)pTVar3 - (long)s_01);
      load_reg_var(s,var_00,iVar1);
      (*gen_add)(s_00,var,var,var_00);
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(var_00 + (long)s_00));
    }
    store_reg(s,a->rd,var);
  }
  return SUB41(((uint)uVar2 & 8) >> 3,0);
}

Assistant:

static bool op_xta(DisasContext *s, arg_rrr_rot *a,
                   void (*gen_extract)(TCGContext *, TCGv_i32, TCGv_i32),
                   void (*gen_add)(TCGContext *, TCGv_i32, TCGv_i32, TCGv_i32))
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp;

    if (!ENABLE_ARCH_6) {
        return false;
    }

    tmp = load_reg(s, a->rm);
    /*
     * TODO: In many cases we could do a shift instead of a rotate.
     * Combined with a simple extend, that becomes an extract.
     */
    tcg_gen_rotri_i32(tcg_ctx, tmp, tmp, a->rot * 8);
    gen_extract(tcg_ctx, tmp, tmp);

    if (a->rn != 15) {
        TCGv_i32 tmp2 = load_reg(s, a->rn);
        gen_add(tcg_ctx, tmp, tmp, tmp2);
        tcg_temp_free_i32(tcg_ctx, tmp2);
    }
    store_reg(s, a->rd, tmp);
    return true;
}